

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtils.cpp
# Opt level: O3

time_point
ApprovalTests::DateUtils::createUtcDateTime
          (int year,int month,int day,int hour,int minute,int second)

{
  time_t tVar1;
  tm timeinfo;
  tm local_38;
  
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_isdst = 0;
  local_38._36_4_ = 0;
  local_38.tm_year = year + -0x76c;
  local_38.tm_mon = month + -1;
  local_38.tm_sec = second;
  local_38.tm_min = minute;
  local_38.tm_hour = hour;
  local_38.tm_mday = day;
  tVar1 = timegm(&local_38);
  return (time_point)(tVar1 * 1000000000);
}

Assistant:

std::chrono::system_clock::time_point
    DateUtils::createUtcDateTime(int year,
                                 int month,
                                 int day,
                                 int hour,
                                 int minute,
                                 int second) // these are UTC values
    {
        tm timeinfo = createTm(year, month, day, hour, minute, second);
        time_t tt = toUtc(timeinfo);
        return std::chrono::system_clock::from_time_t(tt);
    }